

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
geemuboi::test::core::CpuTest_add_hl_bc_carry_Test::TestBody(CpuTest_add_hl_bc_carry_Test *this)

{
  char *message;
  AssertHelper local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertionResult gtest_ar;
  Registers expected_regs;
  
  (this->super_CpuTest).regs.f = 0x80;
  (this->super_CpuTest).regs.h = 0xff;
  (this->super_CpuTest).regs.b = '\x10';
  CpuTest::execute_instruction(&this->super_CpuTest,'\t');
  expected_regs.a = '\0';
  expected_regs.b = '\x10';
  expected_regs.c = '\0';
  expected_regs.d = '\0';
  expected_regs.e = '\0';
  expected_regs.h = '\x0f';
  expected_regs.l = '\0';
  expected_regs.f = 0x90;
  expected_regs.pc = 1;
  expected_regs.sp = 0;
  CpuTest::verify_state_changes(&this->super_CpuTest,&expected_regs);
  local_38.ptr_._0_4_ =
       (*((this->super_CpuTest).cpu._M_t.
          super___uniq_ptr_impl<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>.
          _M_t.
          super__Tuple_impl<0UL,_geemuboi::core::ICpu_*,_std::default_delete<geemuboi::core::ICpu>_>
          .super__Head_base<0UL,_geemuboi::core::ICpu_*,_false>._M_head_impl)->_vptr_ICpu[1])();
  local_40.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"cpu->get_cycles_executed()","2",(uint *)&local_38,
             (int *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0x121,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(CpuTest, add_hl_bc_carry) {
    regs.f = ICpu::Z_FLAG;
    regs.h = 0xFF;
    regs.b = 0x10;
    execute_instruction(0x09);

    ICpu::Registers expected_regs{};
    expected_regs.h = 0x0F;
    expected_regs.b = 0x10;
    expected_regs.f = ICpu::Z_FLAG | ICpu::C_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}